

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

string * __thiscall MD5::hexdigest_abi_cxx11_(string *__return_storage_ptr__,MD5 *this)

{
  allocator<char> *__a;
  int i;
  long lVar1;
  allocator<char> *paVar2;
  char buf [33];
  allocator<char> local_59;
  allocator<char> local_58 [32];
  undefined1 local_38;
  
  if (this->finalized == false) {
    paVar2 = (allocator<char> *)0x20ccb6;
    __a = local_58;
  }
  else {
    paVar2 = local_58;
    for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
      sprintf((char *)paVar2,"%02x",(ulong)this->digest[lVar1]);
      paVar2 = paVar2 + 2;
    }
    paVar2 = local_58;
    local_38 = 0;
    __a = &local_59;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)paVar2,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string MD5::hexdigest() const
{
  if (!finalized)
    return "";
 
  char buf[33];
  for (int i=0; i<16; i++)
    sprintf(buf+i*2, "%02x", digest[i]);
  buf[32]=0;
 
  return std::string(buf);
}